

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppearanceConfigTab.cpp
# Opt level: O0

void __thiscall AppearanceConfigTab::chooseFont(AppearanceConfigTab *this)

{
  QPushButton **ppQVar1;
  int iVar2;
  QObject *object;
  iterator ppQVar3;
  iterator __last;
  QPushButton **ppQVar4;
  QFont *pQVar5;
  QString local_60;
  QFont local_48 [8];
  QFont font;
  QFont local_31;
  const_reference pvStack_30;
  bool ok;
  value_type *meta;
  QPushButton **ppQStack_20;
  int index;
  QPushButton **iter;
  QPushButton *button;
  AppearanceConfigTab *this_local;
  
  button = (QPushButton *)this;
  object = (QObject *)QObject::sender();
  iter = (QPushButton **)qobject_cast<QPushButton*>(object);
  if ((QPushButton *)iter != (QPushButton *)0x0) {
    ppQVar3 = std::array<QPushButton_*,_3UL>::begin(&this->mFontChooseButtons);
    __last = std::array<QPushButton_*,_3UL>::end(&this->mFontChooseButtons);
    ppQVar4 = std::find<QPushButton**,QPushButton*>(ppQVar3,__last,(QPushButton **)&iter);
    ppQStack_20 = ppQVar4;
    ppQVar3 = std::array<QPushButton_*,_3UL>::end(&this->mFontChooseButtons);
    ppQVar1 = ppQStack_20;
    if (ppQVar4 != ppQVar3) {
      ppQVar3 = std::array<QPushButton_*,_3UL>::begin(&this->mFontChooseButtons);
      meta._4_4_ = (int)((ulong)((long)ppQVar1 - (long)ppQVar3) >> 3);
      pvStack_30 = std::array<AppearanceConfigTabTU::FontButtonMeta,_3UL>::operator[]
                             ((array<AppearanceConfigTabTU::FontButtonMeta,_3UL> *)
                              AppearanceConfigTabTU::FontButtonMetas,(long)meta._4_4_);
      pQVar5 = FontTable::operator[](this->mFonts,pvStack_30->index);
      tr(&local_60,"Select a font",(char *)0x0,-1);
      ::operator|(DontUseNativeDialog,MonospacedFonts);
      QFontDialog::getFont
                ((bool *)local_48,&local_31,(QWidget *)pQVar5,(QString *)this,
                 (QFlags_conflict1 *)&local_60);
      QString::~QString(&local_60);
      if (((byte)local_31 & 1) != 0) {
        iVar2 = QFont::pointSize();
        if (0x16 < iVar2) {
          QFont::setPointSize((int)local_48);
        }
        FontTable::set(this->mFonts,pvStack_30->index,local_48);
        updateFontButton(this,meta._4_4_);
        ConfigTab::setDirty<(Config::Category)2>(&this->super_ConfigTab);
      }
      QFont::~QFont(local_48);
    }
  }
  return;
}

Assistant:

void AppearanceConfigTab::chooseFont() {
    auto button = qobject_cast<QPushButton*>(sender());
    if (button) {
        auto iter = std::find(mFontChooseButtons.begin(), mFontChooseButtons.end(), button);
        if (iter != mFontChooseButtons.end()) {
            int index = iter - mFontChooseButtons.begin();
            auto const& meta = TU::FontButtonMetas[index];

            bool ok;
            auto font = QFontDialog::getFont(
                &ok,
                mFonts[meta.index],
                this,
                tr("Select a font"),
                QFontDialog::DontUseNativeDialog | QFontDialog::MonospacedFonts
            );

            if (ok) {
                if (font.pointSize() > TU::MAX_POINT_SIZE) {
                    font.setPointSize(TU::MAX_POINT_SIZE);
                }

                mFonts.set(meta.index, font);
                updateFontButton(index);
                setDirty<Config::CategoryAppearance>();
            }

        }
    }
}